

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Request * __thiscall
kj::anon_unknown_31::ConcurrencyLimitingHttpClient::request
          (Request *__return_storage_ptr__,ConcurrencyLimitingHttpClient *this,HttpMethod method,
          StringPtr url,HttpHeaders *headers,Maybe<unsigned_long> *expectedBodySize)

{
  PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter> **t;
  HttpClient *pHVar1;
  Promise<kj::HttpClient::Response> *pPVar2;
  ConnectionCounter *counter_00;
  Own<kj::AsyncOutputStream> *other;
  String *pSVar3;
  HttpHeaders *pHVar4;
  Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>_>
  *__x;
  TypeByIndex<0UL,_kj::Promise<kj::Own<kj::AsyncOutputStream>_>,_kj::Promise<kj::HttpClient::Response>_>
  *t_00;
  Promise<kj::Own<kj::AsyncOutputStream>_> *params;
  TypeByIndex<1UL,_kj::Promise<kj::Own<kj::AsyncOutputStream>_>,_kj::Promise<kj::HttpClient::Response>_>
  *t_01;
  int __flags;
  StringPtr *params_00;
  void *__child_stack;
  char *__arg;
  Own<kj::(anonymous_namespace)::PromiseOutputStream> local_220;
  undefined1 local_210 [8];
  SplitTuplePromise<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,_kj::Promise<kj::HttpClient::Response>_>_>
  split;
  ConcurrencyLimitingHttpClient *local_1e8;
  HttpMethod local_1e0;
  String local_1d8;
  HttpHeaders local_1c0;
  Maybe<unsigned_long> local_160;
  undefined1 local_150 [8];
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_c__:3979:15),_kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
  combined;
  HttpHeaders headersCopy;
  String urlCopy;
  PromiseFulfillerPair<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
  paf;
  Promise<kj::HttpClient::Response> promise;
  Maybe<unsigned_long> local_88;
  ConcurrencyLimitingHttpClient *local_78;
  char *pcStack_70;
  undefined1 local_60 [8];
  Request request;
  ConnectionCounter counter;
  HttpHeaders *headers_local;
  HttpMethod method_local;
  ConcurrencyLimitingHttpClient *this_local;
  StringPtr url_local;
  ConcurrencyLimitingHttpClient *pCVar5;
  
  __arg = (char *)url.content.size_;
  this_local = (ConcurrencyLimitingHttpClient *)url.content.ptr;
  url_local.content.ptr = __arg;
  url_local.content.size_ = (size_t)__return_storage_ptr__;
  if (this->concurrentRequests < this->maxConcurrentRequests) {
    ConnectionCounter::ConnectionCounter
              ((ConnectionCounter *)&request.response.super_PromiseBase.node.ptr,this);
    pHVar1 = this->inner;
    local_78 = this_local;
    pcStack_70 = url_local.content.ptr;
    Maybe<unsigned_long>::Maybe(&local_88,expectedBodySize);
    (**pHVar1->_vptr_HttpClient)
              (local_60,pHVar1,(ulong)method,local_78,pcStack_70,headers,&local_88);
    Maybe<unsigned_long>::~Maybe(&local_88);
    fireCountChanged(this);
    pPVar2 = mv<kj::Promise<kj::HttpClient::Response>>
                       ((Promise<kj::HttpClient::Response> *)&request.body.ptr);
    counter_00 = mv<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
                           ((ConnectionCounter *)&request.response.super_PromiseBase.node.ptr);
    attachCounter((ConcurrencyLimitingHttpClient *)&paf.fulfiller.ptr,pPVar2,counter_00);
    other = mv<kj::Own<kj::AsyncOutputStream>>((Own<kj::AsyncOutputStream> *)local_60);
    Own<kj::AsyncOutputStream>::Own(&__return_storage_ptr__->body,other);
    t = &paf.fulfiller.ptr;
    pPVar2 = mv<kj::Promise<kj::HttpClient::Response>>((Promise<kj::HttpClient::Response> *)t);
    Promise<kj::HttpClient::Response>::Promise(&__return_storage_ptr__->response,pPVar2);
    Promise<kj::HttpClient::Response>::~Promise((Promise<kj::HttpClient::Response> *)t);
    HttpClient::Request::~Request((Request *)local_60);
    ConnectionCounter::~ConnectionCounter
              ((ConnectionCounter *)&request.response.super_PromiseBase.node.ptr);
  }
  else {
    pCVar5 = this;
    newPromiseAndFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
              ();
    __flags = (int)pCVar5;
    str<kj::StringPtr&>((String *)&headersCopy.ownedStrings.builder.disposer,(kj *)&this_local,
                        params_00);
    HttpHeaders::clone((HttpHeaders *)&combined.super_PromiseBase.node.ptr,(__fn *)headers,
                       __child_stack,__flags,__arg);
    local_1e8 = this;
    local_1e0 = method;
    pSVar3 = mv<kj::String>((String *)&headersCopy.ownedStrings.builder.disposer);
    String::String(&local_1d8,pSVar3);
    pHVar4 = mv<kj::HttpHeaders>((HttpHeaders *)&combined.super_PromiseBase.node.ptr);
    HttpHeaders::HttpHeaders(&local_1c0,pHVar4);
    Maybe<unsigned_long>::Maybe(&local_160,expectedBodySize);
    Promise<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>::
    then<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::request(kj::HttpMethod,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::_lambda(kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter&&)_1_,kj::_::PropagateException>
              ((Promise<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
                *)local_150,(Type *)&urlCopy.content.disposer,(PropagateException *)&local_1e8);
    (anonymous_namespace)::ConcurrencyLimitingHttpClient::
    request(kj::HttpMethod,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::
    {lambda(kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter&&)#1}::
    ~ConnectionCounter((_lambda_kj___anonymous_namespace___ConcurrencyLimitingHttpClient__ConnectionCounter____1_
                        *)&local_1e8);
    Promise<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,_kj::Promise<kj::HttpClient::Response>_>_>::
    split((SplitTuplePromise<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,_kj::Promise<kj::HttpClient::Response>_>_>
           *)local_210,
          (Promise<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,_kj::Promise<kj::HttpClient::Response>_>_>
           *)local_150);
    __x = mv<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>>>
                    ((Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>_>
                      *)&paf.promise.super_PromiseBase.node.ptr);
    std::
    queue<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>_>,_std::deque<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>_>,_std::allocator<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>_>_>_>_>
    ::push(&this->pendingRequests,__x);
    fireCountChanged(this);
    t_00 = get<0ul,kj::_::Tuple<kj::Promise<kj::Own<kj::AsyncOutputStream>>,kj::Promise<kj::HttpClient::Response>>&>
                     ((Tuple<kj::Promise<kj::Own<kj::AsyncOutputStream>_>,_kj::Promise<kj::HttpClient::Response>_>
                       *)local_210);
    params = mv<kj::Promise<kj::Own<kj::AsyncOutputStream>>>(t_00);
    heap<kj::(anonymous_namespace)::PromiseOutputStream,kj::Promise<kj::Own<kj::AsyncOutputStream>>>
              ((kj *)&local_220,params);
    Own<kj::AsyncOutputStream>::Own<kj::(anonymous_namespace)::PromiseOutputStream,void>
              (&__return_storage_ptr__->body,&local_220);
    t_01 = get<1ul,kj::_::Tuple<kj::Promise<kj::Own<kj::AsyncOutputStream>>,kj::Promise<kj::HttpClient::Response>>&>
                     ((Tuple<kj::Promise<kj::Own<kj::AsyncOutputStream>_>,_kj::Promise<kj::HttpClient::Response>_>
                       *)local_210);
    pPVar2 = mv<kj::Promise<kj::HttpClient::Response>>(t_01);
    Promise<kj::HttpClient::Response>::Promise(&__return_storage_ptr__->response,pPVar2);
    Own<kj::(anonymous_namespace)::PromiseOutputStream>::~Own(&local_220);
    _::Tuple<kj::Promise<kj::Own<kj::AsyncOutputStream>_>,_kj::Promise<kj::HttpClient::Response>_>::
    ~Tuple((Tuple<kj::Promise<kj::Own<kj::AsyncOutputStream>_>,_kj::Promise<kj::HttpClient::Response>_>
            *)local_210);
    Promise<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,_kj::Promise<kj::HttpClient::Response>_>_>::
    ~Promise((Promise<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,_kj::Promise<kj::HttpClient::Response>_>_>
              *)local_150);
    HttpHeaders::~HttpHeaders((HttpHeaders *)&combined.super_PromiseBase.node.ptr);
    String::~String((String *)&headersCopy.ownedStrings.builder.disposer);
    PromiseFulfillerPair<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
    ::~PromiseFulfillerPair
              ((PromiseFulfillerPair<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
                *)&urlCopy.content.disposer);
  }
  return __return_storage_ptr__;
}

Assistant:

Request request(HttpMethod method, kj::StringPtr url, const HttpHeaders& headers,
                  kj::Maybe<uint64_t> expectedBodySize = nullptr) override {
    if (concurrentRequests < maxConcurrentRequests) {
      auto counter = ConnectionCounter(*this);
      auto request = inner.request(method, url, headers, expectedBodySize);
      fireCountChanged();
      auto promise = attachCounter(kj::mv(request.response), kj::mv(counter));
      return { kj::mv(request.body), kj::mv(promise) };
    }

    auto paf = kj::newPromiseAndFulfiller<ConnectionCounter>();
    auto urlCopy = kj::str(url);
    auto headersCopy = headers.clone();

    auto combined = paf.promise
        .then([this,
               method,
               urlCopy = kj::mv(urlCopy),
               headersCopy = kj::mv(headersCopy),
               expectedBodySize](ConnectionCounter&& counter) mutable {
      auto req = inner.request(method, urlCopy, headersCopy, expectedBodySize);
      return kj::tuple(kj::mv(req.body), attachCounter(kj::mv(req.response), kj::mv(counter)));
    });
    auto split = combined.split();
    pendingRequests.push(kj::mv(paf.fulfiller));
    fireCountChanged();
    return { kj::heap<PromiseOutputStream>(kj::mv(kj::get<0>(split))), kj::mv(kj::get<1>(split)) };
  }